

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NameFinder.cpp
# Opt level: O3

TreeNodePtr __thiscall
OpenMD::NameFinder::createNode(NameFinder *this,TreeNodePtr *parent,string *name)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  SimInfo *pSVar1;
  pointer pcVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  iterator iVar5;
  key_type *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::TreeNode>_>_>,_bool>
  pVar7;
  TreeNodePtr TVar8;
  undefined1 local_71;
  vector<int,_std::allocator<int>_> local_70;
  undefined1 local_58 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  this->info_ = (SimInfo *)0x0;
  (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  iVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::TreeNode>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::TreeNode>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::TreeNode>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::TreeNode>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::TreeNode>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::TreeNode>_>_>_>
                  *)((name->_M_dataplus)._M_p + 0x38),in_RCX);
  if (iVar5._M_node == (_Base_ptr)((name->_M_dataplus)._M_p + 0x40)) {
    local_58._0_8_ = (SimInfo *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<OpenMD::TreeNode,std::allocator<OpenMD::TreeNode>>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8),(TreeNode **)local_58,
               (allocator<OpenMD::TreeNode> *)&local_71);
    uVar4 = local_58._8_8_;
    uVar3 = local_58._0_8_;
    local_58._0_8_ = (TreeNode *)0x0;
    local_58._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    this->info_ = (SimInfo *)uVar3;
    (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)uVar4;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
      }
    }
    std::__cxx11::string::_M_assign((string *)this->info_);
    pSVar1 = this->info_;
    std::vector<int,_std::allocator<int>_>::vector
              (&local_70,
               (vector<int,_std::allocator<int>_> *)
               &(parent->super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount);
    SelectionSet::resize
              ((SelectionSet *)
               &(pSVar1->randNumGen_).
                super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,&local_70);
    if (local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    pcVar2 = (name->_M_dataplus)._M_p;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::TreeNode>_>
    ::pair<std::shared_ptr<OpenMD::TreeNode>_&,_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::TreeNode>_>
                *)local_58,in_RCX,(shared_ptr<OpenMD::TreeNode> *)this);
    pVar7 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<OpenMD::TreeNode>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<OpenMD::TreeNode>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<OpenMD::TreeNode>>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,std::shared_ptr<OpenMD::TreeNode>>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<OpenMD::TreeNode>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<OpenMD::TreeNode>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<OpenMD::TreeNode>>>>
                        *)(pcVar2 + 0x38),
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::TreeNode>_>
                        *)local_58);
    _Var6._M_pi = pVar7._8_8_;
    if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_pi);
      _Var6._M_pi = extraout_RDX_00;
    }
    if ((TreeNode *)local_58._0_8_ != (TreeNode *)(local_58 + 0x10)) {
      operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
      _Var6._M_pi = extraout_RDX_01;
    }
  }
  else {
    this->info_ = *(SimInfo **)(iVar5._M_node + 2);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->nObjects_,
               (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&iVar5._M_node[2]._M_parent);
    _Var6._M_pi = extraout_RDX;
  }
  TVar8.super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var6._M_pi;
  TVar8.super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (TreeNodePtr)TVar8.super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TreeNodePtr NameFinder::createNode(TreeNodePtr parent,
                                     const std::string& name) {
    TreeNodePtr node;
    std::map<std::string, TreeNodePtr>::iterator foundIter;
    foundIter = parent->children.find(name);
    if (foundIter == parent->children.end()) {
      node       = std::make_shared<TreeNode>();
      node->name = name;
      node->bs.resize(nObjects_);
      parent->children.insert(std::make_pair(name, node));
    } else {
      node = foundIter->second;
    }
    return node;
  }